

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O1

void __thiscall
QTextCursor::insertBlock(QTextCursor *this,QTextBlockFormat *format,QTextCharFormat *_charFormat)

{
  uint uVar1;
  int iVar2;
  QTextCursorPrivate *pQVar3;
  QTextDocumentPrivate *pQVar4;
  char *__filename;
  long in_FS_OFFSET;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (this->d).d.ptr;
  if (pQVar3 != (QTextCursorPrivate *)0x0) {
    if ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1) {
      QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
    }
    if (((this->d).d.ptr)->priv != (QTextDocumentPrivate *)0x0) {
      local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextFormat::QTextFormat((QTextFormat *)local_38,&_charFormat->super_QTextFormat);
      QTextFormat::clearProperty((QTextFormat *)local_38,0);
      pQVar3 = (this->d).d.ptr;
      if ((pQVar3 != (QTextCursorPrivate *)0x0) &&
         ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1)) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
      }
      pQVar3 = (this->d).d.ptr;
      pQVar4 = pQVar3->priv;
      iVar2 = pQVar4->editBlock;
      uVar1 = iVar2 + 1;
      __filename = (char *)(ulong)uVar1;
      pQVar4->editBlock = uVar1;
      if (iVar2 == 0) {
        pQVar4->revision = pQVar4->revision + 1;
      }
      if ((pQVar3 != (QTextCursorPrivate *)0x0) &&
         ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1)) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
      }
      QTextCursorPrivate::remove((this->d).d.ptr,__filename);
      pQVar3 = (this->d).d.ptr;
      if ((pQVar3 != (QTextCursorPrivate *)0x0) &&
         ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1)) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
      }
      QTextCursorPrivate::insertBlock((this->d).d.ptr,format,(QTextCharFormat *)local_38);
      pQVar3 = (this->d).d.ptr;
      if ((pQVar3 != (QTextCursorPrivate *)0x0) &&
         ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1)) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
      }
      QTextDocumentPrivate::endEditBlock(((this->d).d.ptr)->priv);
      pQVar3 = (this->d).d.ptr;
      if ((pQVar3 != (QTextCursorPrivate *)0x0) &&
         ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1)) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
      }
      QTextCursorPrivate::setX((this->d).d.ptr);
      QTextFormat::~QTextFormat((QTextFormat *)local_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextCursor::insertBlock(const QTextBlockFormat &format, const QTextCharFormat &_charFormat)
{
    if (!d || !d->priv)
        return;

    QTextCharFormat charFormat = _charFormat;
    charFormat.clearProperty(QTextFormat::ObjectIndex);

    d->priv->beginEditBlock();
    d->remove();
    d->insertBlock(format, charFormat);
    d->priv->endEditBlock();
    d->setX();
}